

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

vector<int,_std::allocator<int>_> *
eglu::attribMapToList(vector<int,_std::allocator<int>_> *__return_storage_ptr__,AttribMap *attribs)

{
  _Base_ptr p_Var1;
  int local_1c;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (p_Var1 = (attribs->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(attribs->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)(p_Var1 + 1));
    std::vector<int,_std::allocator<int>_>::push_back
              (__return_storage_ptr__,(value_type_conflict1 *)&p_Var1[1].field_0x4);
  }
  local_1c = 0x3038;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>(__return_storage_ptr__,&local_1c);
  return __return_storage_ptr__;
}

Assistant:

vector<EGLint> attribMapToList (const AttribMap& attribs)
{
	vector<EGLint> attribList;

	for (AttribMap::const_iterator it = attribs.begin(); it != attribs.end(); ++it)
	{
		attribList.push_back(it->first);
		attribList.push_back(it->second);
	}

	attribList.push_back(EGL_NONE);

	return attribList;
}